

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

char * imap_atom(char *str,_Bool escape_only)

{
  bool bVar1;
  size_t sVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  lVar7 = 0;
  lVar8 = 0;
  bVar1 = false;
  pcVar4 = str;
  do {
    cVar3 = *pcVar4;
    if (cVar3 == '\"') {
      lVar8 = lVar8 + 1;
    }
    else if (cVar3 == '\\') {
      lVar7 = lVar7 + 1;
    }
    else {
      if (cVar3 == '\0') {
        if ((lVar7 == 0 && lVar8 == 0) && (!bVar1)) {
          pcVar4 = (*Curl_cstrdup)(str);
          return pcVar4;
        }
        sVar2 = strlen(str);
        lVar8 = lVar7 + (ulong)!escape_only * 2 + lVar8;
        pcVar4 = (char *)(*Curl_cmalloc)(sVar2 + lVar8 + 1);
        if (pcVar4 == (char *)0x0) {
          return (char *)0x0;
        }
        lVar8 = lVar8 + sVar2;
        pcVar5 = pcVar4;
        if (escape_only) goto LAB_00132727;
        *pcVar4 = '\"';
        pcVar4[lVar8 + -1] = '\"';
        do {
          pcVar5 = pcVar5 + 1;
LAB_00132727:
          cVar3 = *str;
          if ((cVar3 == '\"') || (cVar3 == '\\')) {
            *pcVar5 = '\\';
            pcVar5 = pcVar5 + 1;
            cVar3 = *str;
          }
          else if (cVar3 == '\0') {
            pcVar4[lVar8] = '\0';
            return pcVar4;
          }
          *pcVar5 = cVar3;
          str = str + 1;
        } while( true );
      }
      if ((!escape_only) && (!bVar1)) {
        cVar6 = '(';
        pcVar5 = "){ %*]";
        do {
          if (cVar3 == cVar6) {
            bVar1 = true;
          }
          cVar6 = *pcVar5;
        } while ((cVar6 != '\0') && (pcVar5 = pcVar5 + 1, !bVar1));
      }
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

static char *imap_atom(const char *str, bool escape_only)
{
  /* !checksrc! disable PARENBRACE 1 */
  const char atom_specials[] = "(){ %*]";
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool others_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Look for "atom-specials", counting the backslash and quote characters as
     these will need escaping */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(!escape_only) {
      const char *p3 = atom_specials;

      while(*p3 && !others_exists) {
        if(*p1 == *p3)
          others_exists = TRUE;

        p3++;
      }
    }

    p1++;
  }

  /* Does the input contain any "atom-special" characters? */
  if(!backsp_count && !quote_count && !others_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (escape_only ? 0 : 2);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(!escape_only) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}